

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ThreadDescriptor::ThreadDescriptor
          (ThreadDescriptor *this,ThreadDescriptor *param_1)

{
  int32_t iVar1;
  ThreadDescriptor *param_1_local;
  ThreadDescriptor *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ThreadDescriptor_009c2338;
  iVar1 = param_1->tid_;
  this->pid_ = param_1->pid_;
  this->tid_ = iVar1;
  ::std::__cxx11::string::string((string *)&this->thread_name_,(string *)&param_1->thread_name_);
  memcpy(&this->chrome_thread_type_,&param_1->chrome_thread_type_,0x24);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ThreadDescriptor::ThreadDescriptor(ThreadDescriptor&&) noexcept = default;